

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O1

void __thiscall
bssl::HPKETest_SetupSenderBufferTooLarge_Test::TestBody
          (HPKETest_SetupSenderBufferTooLarge_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  pointer *__ptr;
  char *message;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  size_t enc_len;
  uint8_t public_key_r [32];
  uint8_t secret_key_r [32];
  uint8_t enc [33];
  ScopedEVP_HPKE_CTX sender_ctx;
  AssertHelper local_390;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  AssertHelper local_378;
  undefined1 local_370 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  size_t local_350;
  uint8_t local_348 [32];
  uint8_t local_328 [32];
  uint8_t local_308 [40];
  EVP_HPKE_CTX local_2e0;
  
  X25519_keypair(local_348,local_328);
  EVP_HPKE_CTX_zero(&local_2e0);
  kem = EVP_hpke_x25519_hkdf_sha256();
  kdf = EVP_hpke_hkdf_sha256();
  aead = EVP_hpke_aes_128_gcm();
  iVar1 = EVP_HPKE_CTX_setup_sender
                    (&local_2e0,local_308,&local_350,0x21,kem,kdf,aead,local_348,0x20,(uint8_t *)0x0
                     ,0);
  local_388._M_head_impl._0_1_ = iVar1 != 0;
  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_370,(internal *)&local_388,
               (AssertionResult *)
               "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0)"
               ,"false","true",(char *)kdf);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x25c,(char *)CONCAT71(local_370._1_7_,local_370[0]));
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_370._1_7_,local_370[0]) != &local_360) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_370._1_7_,local_370[0]),local_360._M_allocated_capacity + 1)
      ;
    }
    if (local_390.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_390.data_ + 8))();
    }
  }
  if (local_380 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_380,local_380);
  }
  local_388._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_370,"size_t{32}","enc_len",(unsigned_long *)&local_388,&local_350);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x25d,message);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if (local_388._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_388._M_head_impl + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_368,local_368);
  }
  EVP_HPKE_CTX_cleanup(&local_2e0);
  return;
}

Assistant:

TEST(HPKETest, SetupSenderBufferTooLarge) {
  uint8_t secret_key_r[X25519_PRIVATE_KEY_LEN];
  uint8_t public_key_r[X25519_PUBLIC_VALUE_LEN];
  X25519_keypair(public_key_r, secret_key_r);

  // Too large of an output buffer is fine because the function reports the
  // actual length.
  ScopedEVP_HPKE_CTX sender_ctx;
  uint8_t enc[X25519_PUBLIC_VALUE_LEN + 1];
  size_t enc_len;
  EXPECT_TRUE(EVP_HPKE_CTX_setup_sender(
      sender_ctx.get(), enc, &enc_len, sizeof(enc),
      EVP_hpke_x25519_hkdf_sha256(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), public_key_r, sizeof(public_key_r), nullptr, 0));
  EXPECT_EQ(size_t{X25519_PUBLIC_VALUE_LEN}, enc_len);
}